

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableParameter.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::VariableParameter::Decode(VariableParameter *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KUINT8 i;
  long lVar2;
  allocator<char> local_41;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    KDataStream::Read(stream,&this->m_ui8VarParamType);
    for (lVar2 = 0; lVar2 != 0xf; lVar2 = lVar2 + 1) {
      KDataStream::Read(stream,this->m_Data + lVar2);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void VariableParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VARIABLE_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

	stream >> m_ui8VarParamType;
		
	for( KUINT8 i = 0; i < 15; ++i )
	{
		stream >> m_Data[i];
	}
}